

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * __thiscall
Lowerer::InsertObjectCheck
          (Lowerer *this,RegOpnd *funcOpnd,Instr *insertBeforeInstr,BailOutKind bailOutKind,
          BailOutInfo *bailOutInfo)

{
  Func *func;
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  BailOutInstrTemplate<IR::Instr> *this_00;
  undefined4 *puVar4;
  
  this_00 = IR::BailOutInstrTemplate<IR::Instr>::New
                      (BailOnNotObject,bailOutKind,bailOutInfo,bailOutInfo->bailOutFunc);
  if ((this_00->super_Instr).m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar2) goto LAB_005e2d85;
    *puVar4 = 0;
  }
  func = (this_00->super_Instr).m_func;
  if ((funcOpnd->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar2) {
LAB_005e2d85:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  bVar3 = (funcOpnd->super_Opnd).field_0xb;
  if ((bVar3 & 2) != 0) {
    funcOpnd = (RegOpnd *)IR::Opnd::Copy(&funcOpnd->super_Opnd,func);
    bVar3 = (funcOpnd->super_Opnd).field_0xb;
  }
  (funcOpnd->super_Opnd).field_0xb = bVar3 | 2;
  (this_00->super_Instr).m_src1 = &funcOpnd->super_Opnd;
  IR::Instr::SetByteCodeOffset(&this_00->super_Instr,insertBeforeInstr);
  IR::Instr::InsertBefore(insertBeforeInstr,&this_00->super_Instr);
  return &this_00->super_Instr;
}

Assistant:

IR::Instr*
Lowerer::InsertObjectCheck(IR::RegOpnd *funcOpnd, IR::Instr *insertBeforeInstr, IR::BailOutKind bailOutKind, BailOutInfo *bailOutInfo)
{
    IR::Instr *bailOutIfNotObject = IR::BailOutInstr::New(Js::OpCode::BailOnNotObject, bailOutKind, bailOutInfo, bailOutInfo->bailOutFunc);

    // Bailout when funcOpnd is not an object.
    bailOutIfNotObject->SetSrc1(funcOpnd);
    bailOutIfNotObject->SetByteCodeOffset(insertBeforeInstr);
    insertBeforeInstr->InsertBefore(bailOutIfNotObject);

    return bailOutIfNotObject;
}